

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_energy.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  type_info_t *ptVar1;
  type_info_t *ptVar2;
  fvar<double,_2UL> beta;
  long lVar3;
  bool bVar4;
  char cVar5;
  size_t sVar6;
  istream *piVar7;
  ostream *poVar8;
  char *pcVar9;
  fvar<double,_2UL> result;
  real_t t_step;
  real_t t_max;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  real_t t_min;
  char *local_a8;
  undefined8 local_a0;
  type_info_t *local_98;
  type_info_t *local_90;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_88;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  double local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  if (argc == 1) {
    piVar7 = std::istream::_M_extract<double>((double *)&std::cin);
    piVar7 = std::istream::_M_extract<double>((double *)piVar7);
    piVar7 = std::istream::_M_extract<double>((double *)piVar7);
    piVar7 = std::istream::_M_extract<double>((double *)piVar7);
    piVar7 = std::istream::_M_extract<double>((double *)piVar7);
    std::istream::_M_extract<double>((double *)piVar7);
  }
  else {
    if (argc != 7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
      pcVar9 = *argv;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f2e8);
      }
      else {
        sVar6 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," [Ja Jb Jc t_min t_max t_step]\n",0x1f);
      return 0x7f;
    }
    local_a8 = (char *)0x0;
    ptVar1 = (type_info_t *)((long)&local_a0 + 4);
    ptVar2 = (type_info_t *)argv[1];
    local_98 = ptVar2;
    local_90 = ptVar1;
    sVar6 = strlen((char *)ptVar2);
    local_90 = ptVar2 + sVar6;
    local_88.start = (char *)ptVar2;
    local_88.finish = (char *)local_90;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            float_types_converter_internal<double>(&local_88,(double *)&local_a8);
    if (!bVar4) {
      local_a0 = &PTR__bad_cast_0010daa8;
      local_98 = (type_info_t *)&char*::typeinfo;
      local_90 = (type_info_t *)&double::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_a0);
    }
    local_60 = local_a8;
    local_a8 = (char *)0x0;
    ptVar2 = (type_info_t *)argv[2];
    local_98 = ptVar2;
    local_90 = ptVar1;
    sVar6 = strlen((char *)ptVar2);
    local_90 = ptVar2 + sVar6;
    local_88.start = (char *)ptVar2;
    local_88.finish = (char *)local_90;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            float_types_converter_internal<double>(&local_88,(double *)&local_a8);
    if (!bVar4) {
      local_a0 = &PTR__bad_cast_0010daa8;
      local_98 = (type_info_t *)&char*::typeinfo;
      local_90 = (type_info_t *)&double::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_a0);
    }
    local_68 = local_a8;
    local_a8 = (char *)0x0;
    ptVar2 = (type_info_t *)argv[3];
    local_98 = ptVar2;
    local_90 = ptVar1;
    sVar6 = strlen((char *)ptVar2);
    local_90 = ptVar2 + sVar6;
    local_88.start = (char *)ptVar2;
    local_88.finish = (char *)local_90;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            float_types_converter_internal<double>(&local_88,(double *)&local_a8);
    if (!bVar4) {
      local_a0 = &PTR__bad_cast_0010daa8;
      local_98 = (type_info_t *)&char*::typeinfo;
      local_90 = (type_info_t *)&double::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_a0);
    }
    local_70 = local_a8;
    local_a8 = (char *)0x0;
    ptVar2 = (type_info_t *)argv[4];
    local_98 = ptVar2;
    local_90 = ptVar1;
    sVar6 = strlen((char *)ptVar2);
    local_90 = ptVar2 + sVar6;
    local_88.start = (char *)ptVar2;
    local_88.finish = (char *)local_90;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            float_types_converter_internal<double>(&local_88,(double *)&local_a8);
    if (!bVar4) {
      local_a0 = &PTR__bad_cast_0010daa8;
      local_98 = (type_info_t *)&char*::typeinfo;
      local_90 = (type_info_t *)&double::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_a0);
    }
    local_50 = local_a8;
    local_a8 = (char *)0x0;
    ptVar2 = (type_info_t *)argv[5];
    local_98 = ptVar2;
    local_90 = ptVar1;
    sVar6 = strlen((char *)ptVar2);
    local_90 = ptVar2 + sVar6;
    local_88.start = (char *)ptVar2;
    local_88.finish = (char *)local_90;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            float_types_converter_internal<double>(&local_88,(double *)&local_a8);
    if (!bVar4) {
      local_a0 = &PTR__bad_cast_0010daa8;
      local_98 = (type_info_t *)&char*::typeinfo;
      local_90 = (type_info_t *)&double::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_a0);
    }
    local_78 = local_a8;
    local_a8 = (char *)0x0;
    ptVar2 = (type_info_t *)argv[6];
    local_98 = ptVar2;
    local_90 = ptVar1;
    sVar6 = strlen((char *)ptVar2);
    local_90 = ptVar2 + sVar6;
    local_88.start = (char *)ptVar2;
    local_88.finish = (char *)local_90;
    bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            float_types_converter_internal<double>(&local_88,(double *)&local_a8);
    if (!bVar4) {
      local_a0 = &PTR__bad_cast_0010daa8;
      local_98 = (type_info_t *)&char*::typeinfo;
      local_90 = (type_info_t *)&double::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_a0);
    }
    local_88.start = local_a8;
  }
  lVar3 = std::cout;
  *(uint *)(std::runtime_error::what + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::what + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar3 + -0x18)) = 0xf;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"# triangular lattice Ising model\n",0x21);
  pcVar9 = "# Ja, Jb, Jc, T, free energy density, energy density, specific heat\n";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "# Ja, Jb, Jc, T, free energy density, energy density, specific heat\n",0x44);
  if ((double)local_50 <= (double)local_78) {
    local_58 = local_50;
    do {
      local_48 = 1.0 / (double)local_58;
      uStack_40 = 0x3ff0000000000000;
      uStack_38 = 0;
      beta.v._M_elems[1] = 1.0;
      beta.v._M_elems[0] = local_48;
      beta.v._M_elems[2] = 0.0;
      ising::free_energy::triangular::
      infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                ((fvar<double,_2UL> *)&local_a0,(triangular *)pcVar9,(double)local_60,
                 (double)local_68,(double)local_70,beta);
      poVar8 = std::ostream::_M_insert<double>((double)local_60);
      local_a8._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_a8,1);
      poVar8 = std::ostream::_M_insert<double>((double)local_68);
      local_a8._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_a8,1);
      poVar8 = std::ostream::_M_insert<double>((double)local_70);
      local_a8._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_a8,1);
      poVar8 = std::ostream::_M_insert<double>((double)local_58);
      local_a8 = (char *)CONCAT71(local_a8._1_7_,0x20);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_a8,1);
      poVar8 = boost::math::differentiation::autodiff_v1::detail::operator<<
                         (poVar8,(fvar<double,_2UL> *)&local_a0);
      cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      pcVar9 = (char *)(ulong)(uint)(int)cVar5;
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      local_58 = (char *)((double)local_58 + (double)local_88.start);
    } while ((double)local_58 <= (double)local_78);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  typedef double real_t;
  real_t Ja, Jb, Jc, t_min, t_max, t_step;
  if (argc == 7) {
    Ja = boost::lexical_cast<real_t>(argv[1]);
    Jb = boost::lexical_cast<real_t>(argv[2]);
    Jc = boost::lexical_cast<real_t>(argv[3]);
    t_min = boost::lexical_cast<real_t>(argv[4]);
    t_max = boost::lexical_cast<real_t>(argv[5]);
    t_step = boost::lexical_cast<real_t>(argv[6]);
  } else if (argc == 1) {
    std::cin >> Ja >> Jb >> Jc >> t_min >> t_max >> t_step;
  } else {
    std::cerr << "Usage: " << argv[0] << " [Ja Jb Jc t_min t_max t_step]\n";
    return 127;
  }
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10);
  std::cout << "# triangular lattice Ising model\n";
  std::cout << "# Ja, Jb, Jc, T, free energy density, energy density, specific heat\n";
  for (real_t t = t_min; t <= t_max; t += t_step) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto result = ising::free_energy::triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' ' << result << std::endl;
  }
}